

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O0

void __thiscall ArgTest_VisitInvalidArg_Test::TestBody(ArgTest_VisitInvalidArg_Test *this)

{
  StrictMock<mock_visitor<fmt::v5::monostate>_> *vis;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  arg;
  StrictMock<mock_visitor<fmt::v5::monostate>_> visitor;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *in_stack_fffffffffffffec8;
  mock_visitor<fmt::v5::monostate> *in_stack_fffffffffffffed0;
  StrictMock<mock_visitor<fmt::v5::monostate>_> *in_stack_fffffffffffffef0;
  char *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd4;
  char *in_stack_ffffffffffffffd8;
  MockSpec<test_result_(fmt::v5::monostate)> *in_stack_ffffffffffffffe0;
  
  testing::StrictMock<mock_visitor<fmt::v5::monostate>_>::StrictMock(in_stack_fffffffffffffef0);
  testing::internal::AnythingMatcher::operator_cast_to_Matcher
            ((AnythingMatcher *)in_stack_fffffffffffffec8);
  vis = (StrictMock<mock_visitor<fmt::v5::monostate>_> *)
        mock_visitor<fmt::v5::monostate>::gmock_visit
                  (in_stack_fffffffffffffed0,
                   (Matcher<fmt::v5::monostate> *)in_stack_fffffffffffffec8);
  testing::internal::MockSpec<test_result_(fmt::v5::monostate)>::InternalExpectedAt
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
             in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  testing::Matcher<fmt::v5::monostate>::~Matcher((Matcher<fmt::v5::monostate> *)0x12254c);
  fmt::v5::
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  ::basic_format_arg((basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                      *)vis);
  fmt::v5::
  visit<testing::StrictMock<mock_visitor<fmt::v5::monostate>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            (vis,in_stack_fffffffffffffec8);
  testing::StrictMock<mock_visitor<fmt::v5::monostate>_>::~StrictMock(vis);
  return;
}

Assistant:

TEST(ArgTest, VisitInvalidArg) {
  testing::StrictMock< mock_visitor<fmt::monostate> > visitor;
  EXPECT_CALL(visitor, visit(_));
  fmt::basic_format_arg<fmt::format_context> arg;
  visit(visitor, arg);
}